

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  lu_byte x;
  DumpState D;
  long local_48;
  DumpState local_40;
  
  local_40.status = 0;
  local_40.L = L;
  local_40.writer = w;
  local_40.data = data;
  local_40.strip = strip;
  local_40.status = (*w)(L,"\x1bLua",4,data);
  local_48._0_1_ = 0x54;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  local_48 = (ulong)local_48._1_7_ << 8;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  if (local_40.status == 0) {
    local_40.status = (*w)(L,anon_var_dwarf_f020,6,data);
  }
  local_48._0_1_ = 4;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  local_48._0_1_ = 8;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  local_48 = CONCAT71(local_48._1_7_,8);
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  local_48 = 0x5678;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,8,data);
  }
  local_48 = 0x4077280000000000;
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,8,data);
  }
  local_48 = CONCAT71(local_48._1_7_,(char)f->sizeupvalues);
  if (local_40.status == 0) {
    local_40.status = (*w)(L,&local_48,1,data);
  }
  dumpFunction(&local_40,f,(TString *)0x0);
  return local_40.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f, NULL);
  return D.status;
}